

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O3

void __thiscall re2c::free_list<re2c::RegExp_*>::clear(free_list<re2c::RegExp_*> *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->in_clear = true;
  for (p_Var1 = (this->
                super_set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>)
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<re2c::RegExp_*,_re2c::RegExp_*,_std::_Identity<re2c::RegExp_*>,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>
  ::clear((_Rb_tree<re2c::RegExp_*,_re2c::RegExp_*,_std::_Identity<re2c::RegExp_*>,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>
           *)this);
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}